

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O3

void duckdb::ExecuteMakeDate<long>(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference a;
  reference b;
  reference c;
  
  a = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  b = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  c = vector<duckdb::Vector,_true>::operator[](&input->data,2);
  TernaryExecutor::
  ExecuteGeneric<long,long,long,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(long,long,long)>
            (a,b,c,result,input->count,MakeDateOperator::Operation<long,long,long,duckdb::date_t>);
  return;
}

Assistant:

static void ExecuteMakeDate(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 3);
	auto &yyyy = input.data[0];
	auto &mm = input.data[1];
	auto &dd = input.data[2];

	TernaryExecutor::Execute<T, T, T, date_t>(yyyy, mm, dd, result, input.size(),
	                                          MakeDateOperator::Operation<T, T, T, date_t>);
}